

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O2

void out_init(void)

{
  out_stream_info *stream;
  
  outflag = 1;
  outcnt = 0;
  hidout = 0;
  G_user_filter = 0xffff;
  stream = &G_std_disp;
  out_state_init(&G_std_disp);
  G_std_disp.do_print = do_std_print;
  G_std_disp.use_more_mode = 1;
  out_init_log(stream);
  return;
}

Assistant:

void out_init()
{
    /* not yet hiding output */
    outflag = 1;
    outcnt = 0;
    hidout = 0;

    /* initialize the standard display stream */
    out_init_std(&G_std_disp);

    /* initialize the log file stream */
    out_init_log(&G_log_disp);
}